

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

TypedDeleter<LLVMBC::ConstantExpr> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ConstantExpr>,LLVMBC::ConstantExpr*&>
          (LLVMContext *this,ConstantExpr **u)

{
  ConstantExpr *pCVar1;
  TypedDeleter<LLVMBC::ConstantExpr> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::ConstantExpr> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::ConstantExpr> *)0x0) {
    pCVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f3300;
    pTVar2->ptr = pCVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}